

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool ppk_loadpub_s(BinarySource *src,char **algorithm,BinarySink *bs,char **commentptr,
                   char **errorstr)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  ssh_keyalg *psVar4;
  _Bool ret_1;
  char *pcStack_90;
  _Bool ret;
  char *comment;
  char *error;
  int i;
  int type;
  ssh_keyalg *alg;
  char *b;
  char header [40];
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  char **algorithm_local;
  BinarySource *src_local;
  
  pcStack_90 = (char *)0x0;
  iVar2 = key_type_s(src);
  if (iVar2 == 9) {
    src_local._7_1_ = rfc4716_loadpub(src,algorithm,bs,commentptr,errorstr);
  }
  else if (iVar2 == 10) {
    src_local._7_1_ = openssh_loadpub(src,algorithm,bs,commentptr,errorstr);
  }
  else {
    if (iVar2 == 3) {
      _Var1 = read_header(src,(char *)&b);
      if ((_Var1) &&
         (((iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-3"), iVar2 == 0 ||
           (iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-2"), iVar2 == 0)) ||
          (iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-1"), iVar2 == 0)))) {
        comment = "file format error";
        pcVar3 = read_body(src);
        if (pcVar3 != (char *)0x0) {
          psVar4 = find_pubkey_alg(pcVar3);
          safefree(pcVar3);
          if (((psVar4 != (ssh_keyalg *)0x0) && (_Var1 = read_header(src,(char *)&b), _Var1)) &&
             ((iVar2 = strcmp((char *)&b,"Encryption"), iVar2 == 0 &&
              (pcVar3 = read_body(src), pcVar3 != (char *)0x0)))) {
            safefree(pcVar3);
            _Var1 = read_header(src,(char *)&b);
            if (((_Var1) && (iVar2 = strcmp((char *)&b,"Comment"), iVar2 == 0)) &&
               (pcStack_90 = read_body(src), pcStack_90 != (char *)0x0)) {
              if (commentptr == (char **)0x0) {
                safefree(pcStack_90);
              }
              else {
                *commentptr = pcStack_90;
              }
              _Var1 = read_header(src,(char *)&b);
              if (((_Var1) && (iVar2 = strcmp((char *)&b,"Public-Lines"), iVar2 == 0)) &&
                 (pcVar3 = read_body(src), pcVar3 != (char *)0x0)) {
                iVar2 = userkey_parse_line_counter(pcVar3);
                safefree(pcVar3);
                if ((-1 < iVar2) && (_Var1 = read_blob(src,iVar2,bs), _Var1)) {
                  if (algorithm != (char **)0x0) {
                    pcVar3 = dupstr(psVar4->ssh_id);
                    *algorithm = pcVar3;
                  }
                  return true;
                }
              }
            }
          }
        }
      }
      else {
        iVar2 = strncmp((char *)&b,"PuTTY-User-Key-File-",0x14);
        if (iVar2 == 0) {
          comment = "PuTTY key format too new";
        }
        else {
          comment = "not a public key or a PuTTY SSH-2 private key";
        }
      }
    }
    else {
      comment = "not a public key or a PuTTY SSH-2 private key";
    }
    if (errorstr != (char **)0x0) {
      *errorstr = comment;
    }
    if ((pcStack_90 != (char *)0x0) && (commentptr != (char **)0x0)) {
      safefree(pcStack_90);
      *commentptr = (char *)0x0;
    }
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

bool ppk_loadpub_s(BinarySource *src, char **algorithm, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    char header[40], *b;
    const ssh_keyalg *alg;
    int type, i;
    const char *error = NULL;
    char *comment = NULL;

    /* Initially, check if this is a public-only key file. Sometimes
     * we'll be asked to read a public blob from one of those. */
    type = key_type_s(src);
    if (type == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        bool ret = rfc4716_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        bool ret = openssh_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type != SSH_KEYTYPE_SSH2) {
        error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        if (0 == strncmp(header, "PuTTY-User-Key-File-", 20))
            error = "PuTTY key format too new";
        else
            error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    sfree(b);
    if (!alg) {
        goto error;
    }

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    sfree(b);                          /* we don't care */

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    if (!read_blob(src, i, bs))
        goto error;

    if (algorithm)
        *algorithm = dupstr(alg->ssh_id);
    return true;

    /*
     * Error processing.
     */
  error:
    if (errorstr)
        *errorstr = error;
    if (comment && commentptr) {
        sfree(comment);
        *commentptr = NULL;
    }
    return false;
}